

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_NumericConstant_Test::TestBody(ExprTest_NumericConstant_Test *this)

{
  NumericConstant other;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  NumericConstant e;
  undefined1 in_stack_fffffffffffffe8f;
  AssertionResult *in_stack_fffffffffffffe90;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffe98;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  char *in_stack_fffffffffffffea8;
  int iVar5;
  AssertionResult *this_02;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  undefined8 in_stack_fffffffffffffeb8;
  Type type;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult *this_03;
  char *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  AssertionResult *in_stack_ffffffffffffff08;
  Message *message;
  AssertHelper *in_stack_ffffffffffffff10;
  string local_e0 [48];
  AssertionResult local_b0 [2];
  Kind local_90;
  undefined4 local_8c;
  AssertionResult local_88;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_78;
  Impl *local_70;
  string local_60 [64];
  AssertionResult local_20;
  ExprBase local_10 [2];
  
  type = (Type)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  mp::NumericConstant::NumericConstant((NumericConstant *)0x11a35e);
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffe90,(bool)in_stack_fffffffffffffe8f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffec0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffec0,type,
               (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0x11a470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11a4eb);
  local_70 = local_10[0].impl_;
  other.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._7_1_ =
       in_stack_fffffffffffffea7;
  other.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_7_ =
       in_stack_fffffffffffffea0;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffe98,other,
             (type_conflict)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  local_78.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                 (in_stack_fffffffffffffe98,(double)in_stack_fffffffffffffe90);
  local_8c = 1;
  local_10[0].impl_ = (Impl *)local_78.super_ExprBase.impl_;
  local_90 = mp::internal::ExprBase::kind((ExprBase *)0x11a558);
  this_03 = &local_88;
  testing::internal::EqHelper<false>::Compare<mp::expr::Kind,mp::expr::Kind>
            (in_stack_fffffffffffffea8,
             (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             (Kind *)in_stack_fffffffffffffe98,(Kind *)in_stack_fffffffffffffe90);
  iVar5 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_03);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x11a5f5);
    type = (Type)((ulong)pcVar4 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,
               (char *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),iVar5,
               (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    testing::Message::~Message((Message *)0x11a652);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11a6a7);
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  this_02 = local_b0;
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffe90,(bool)in_stack_fffffffffffffe8f);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_02);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_03);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,(char *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),
               (int)((ulong)this_02 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff10,(Message *)in_stack_ffffffffffffff08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe90);
    std::__cxx11::string::~string(local_e0);
    testing::Message::~Message((Message *)0x11a7c2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11a83a);
  message = (Message *)0x3ff3ae147ae147ae;
  mp::NumericConstant::value((NumericConstant *)0x11a859);
  this_01 = (AssertionResult *)&stack0xffffffffffffff10;
  testing::internal::EqHelper<false>::Compare<double,double>
            (&this_02->success_,
             (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),(double *)this_01
             ,(double *)in_stack_fffffffffffffe90);
  iVar5 = (int)((ulong)this_02 >> 0x20);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)this_03);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x11a8ef)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_03,type,(char *)CONCAT17(uVar2,in_stack_fffffffffffffeb0),iVar5,
               (char *)CONCAT17(uVar3,in_stack_fffffffffffffea0));
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff10,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x11a93d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11a98c);
  return;
}

Assistant:

TEST_F(ExprTest, NumericConstant) {
  mp::NumericConstant e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  e = factory_.MakeNumericConstant(1.23);
  EXPECT_EQ(expr::NUMBER, e.kind());
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(1.23, e.value());
}